

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O1

void dctInverse8x8_sse2_6(float *data)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined8 uVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fStack_88;
  float fStack_84;
  __m128 in [8];
  
  fVar25 = data[1];
  fVar16 = data[2];
  fVar8 = data[3];
  fVar23 = data[4];
  fVar9 = data[5];
  fVar24 = data[6];
  fVar10 = data[7];
  fVar11 = data[9];
  fVar17 = data[10];
  fVar18 = data[0xb];
  fVar19 = data[0xc];
  fVar20 = data[0xd];
  fVar21 = data[0xe];
  fVar22 = data[0xf];
  fVar12 = *data * 0.3535536 + 0.0;
  fVar13 = fVar12 + fVar16 * 0.4619398 + fVar23 * 0.3535536 + fVar24 * 0.1913422;
  fVar14 = fVar12 + fVar16 * 0.1913422 + fVar23 * -0.3535536 + fVar24 * -0.4619398;
  fVar15 = fVar12 + fVar16 * -0.1913422 + fVar23 * -0.3535536 + fVar24 * 0.4619398;
  fVar16 = fVar12 + fVar16 * -0.4619398 + fVar23 * 0.3535536 + fVar24 * -0.1913422;
  fVar23 = fVar25 * 0.4903927 + 0.0 + fVar8 * 0.4157349 + fVar9 * 0.2777855 + fVar10 * 0.09754573;
  fVar24 = fVar25 * 0.4157349 + 0.0 + fVar8 * -0.09754573 + fVar9 * -0.4903927 + fVar10 * -0.2777855
  ;
  fVar12 = fVar25 * 0.2777855 + 0.0 + fVar8 * -0.4903927 + fVar9 * 0.09754573 + fVar10 * 0.4157349;
  fVar25 = fVar25 * 0.09754573 + 0.0 + fVar8 * -0.2777855 + fVar9 * 0.4157349 + fVar10 * -0.4903927;
  *data = fVar13 + fVar23;
  data[1] = fVar14 + fVar24;
  data[2] = fVar15 + fVar12;
  data[3] = fVar16 + fVar25;
  data[4] = fVar16 - fVar25;
  data[5] = fVar15 - fVar12;
  data[6] = fVar14 - fVar24;
  data[7] = fVar13 - fVar23;
  fVar25 = data[8] * 0.3535536 + 0.0;
  fVar16 = fVar25 + fVar17 * 0.4619398 + fVar19 * 0.3535536 + fVar21 * 0.1913422;
  fVar8 = fVar25 + fVar17 * 0.1913422 + fVar19 * -0.3535536 + fVar21 * -0.4619398;
  fVar23 = fVar25 + fVar17 * -0.1913422 + fVar19 * -0.3535536 + fVar21 * 0.4619398;
  fVar25 = fVar25 + fVar17 * -0.4619398 + fVar19 * 0.3535536 + fVar21 * -0.1913422;
  fVar9 = fVar11 * 0.4903927 + 0.0 + fVar18 * 0.4157349 + fVar20 * 0.2777855 + fVar22 * 0.09754573;
  fVar24 = fVar11 * 0.4157349 + 0.0 + fVar18 * -0.09754573 + fVar20 * -0.4903927 +
           fVar22 * -0.2777855;
  fVar10 = fVar11 * 0.2777855 + 0.0 + fVar18 * -0.4903927 + fVar20 * 0.09754573 + fVar22 * 0.4157349
  ;
  fVar11 = fVar11 * 0.09754573 + 0.0 + fVar18 * -0.2777855 + fVar20 * 0.4157349 +
           fVar22 * -0.4903927;
  data[8] = fVar16 + fVar9;
  data[9] = fVar8 + fVar24;
  data[10] = fVar23 + fVar10;
  data[0xb] = fVar25 + fVar11;
  data[0xc] = fVar25 - fVar11;
  data[0xd] = fVar23 - fVar10;
  data[0xe] = fVar8 - fVar24;
  data[0xf] = fVar16 - fVar9;
  lVar4 = 0;
  pfVar5 = data;
  do {
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)pfVar5 + lVar6 * 2);
      uVar3 = puVar1[1];
      *(undefined8 *)((long)in[-1] + lVar6 + 8) = *puVar1;
      *(undefined8 *)((long)in[0] + lVar6) = uVar3;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x80);
    fVar21 = in[1][2] * 0.1913422 - in[5][2] * 0.4619398;
    fVar22 = in[1][3] * 0.1913422 - in[5][3] * 0.4619398;
    fVar12 = in[2][0] * 0.1913422 - in[6][0] * 0.4619398;
    fVar13 = in[2][1] * 0.1913422 - in[6][1] * 0.4619398;
    fVar14 = in[5][2] * 0.1913422 + in[1][2] * 0.4619398;
    fVar15 = in[5][3] * 0.1913422 + in[1][3] * 0.4619398;
    fVar26 = in[6][0] * 0.1913422 + in[2][0] * 0.4619398;
    fVar27 = in[6][1] * 0.1913422 + in[2][1] * 0.4619398;
    fVar25 = in[6][2] * 0.09754573 + in[4][2] * 0.2777855 +
             in[2][2] * 0.4157349 + in[0][2] * 0.4903927;
    fVar16 = in[6][3] * 0.09754573 + in[4][3] * 0.2777855 +
             in[2][3] * 0.4157349 + in[0][3] * 0.4903927;
    fVar8 = in[7][0] * 0.09754573 + in[5][0] * 0.2777855 +
            in[3][0] * 0.4157349 + in[1][0] * 0.4903927;
    fVar23 = in[7][1] * 0.09754573 + in[5][1] * 0.2777855 +
             in[3][1] * 0.4157349 + in[1][1] * 0.4903927;
    fVar28 = (in[0][2] * 0.4157349 - in[2][2] * 0.09754573) -
             (in[6][2] * 0.2777855 + in[4][2] * 0.4903927);
    fVar29 = (in[0][3] * 0.4157349 - in[2][3] * 0.09754573) -
             (in[6][3] * 0.2777855 + in[4][3] * 0.4903927);
    fVar30 = (in[1][0] * 0.4157349 - in[3][0] * 0.09754573) -
             (in[7][0] * 0.2777855 + in[5][0] * 0.4903927);
    fVar31 = (in[1][1] * 0.4157349 - in[3][1] * 0.09754573) -
             (in[7][1] * 0.2777855 + in[5][1] * 0.4903927);
    fVar40 = in[6][2] * 0.4157349 + in[4][2] * 0.09754573 +
             (in[0][2] * 0.2777855 - in[2][2] * 0.4903927);
    fVar41 = in[6][3] * 0.4157349 + in[4][3] * 0.09754573 +
             (in[0][3] * 0.2777855 - in[2][3] * 0.4903927);
    fVar42 = in[7][0] * 0.4157349 + in[5][0] * 0.09754573 +
             (in[1][0] * 0.2777855 - in[3][0] * 0.4903927);
    fVar43 = in[7][1] * 0.4157349 + in[5][1] * 0.09754573 +
             (in[1][1] * 0.2777855 - in[3][1] * 0.4903927);
    fVar9 = (in[4][2] * 0.4157349 - in[6][2] * 0.4903927) +
            (in[0][2] * 0.09754573 - in[2][2] * 0.2777855);
    fVar24 = (in[4][3] * 0.4157349 - in[6][3] * 0.4903927) +
             (in[0][3] * 0.09754573 - in[2][3] * 0.2777855);
    fVar10 = (in[5][0] * 0.4157349 - in[7][0] * 0.4903927) +
             (in[1][0] * 0.09754573 - in[3][0] * 0.2777855);
    fVar11 = (in[5][1] * 0.4157349 - in[7][1] * 0.4903927) +
             (in[1][1] * 0.09754573 - in[3][1] * 0.2777855);
    fVar32 = (fStack_88 + in[3][2]) * 0.3535536;
    fVar33 = (fStack_84 + in[3][3]) * 0.3535536;
    fVar34 = (in[0][0] + in[4][0]) * 0.3535536;
    fVar35 = (in[0][1] + in[4][1]) * 0.3535536;
    fVar36 = (fStack_88 - in[3][2]) * 0.3535536;
    fVar37 = (fStack_84 - in[3][3]) * 0.3535536;
    fVar38 = (in[0][0] - in[4][0]) * 0.3535536;
    fVar39 = (in[0][1] - in[4][1]) * 0.3535536;
    fVar17 = fVar21 + fVar36;
    fVar18 = fVar22 + fVar37;
    fVar19 = fVar12 + fVar38;
    fVar20 = fVar13 + fVar39;
    fVar36 = fVar36 - fVar21;
    fVar37 = fVar37 - fVar22;
    fVar38 = fVar38 - fVar12;
    fVar39 = fVar39 - fVar13;
    fVar21 = fVar14 + fVar32;
    fVar22 = fVar15 + fVar33;
    fVar12 = fVar26 + fVar34;
    fVar13 = fVar27 + fVar35;
    fVar32 = fVar32 - fVar14;
    fVar33 = fVar33 - fVar15;
    fVar34 = fVar34 - fVar26;
    fVar35 = fVar35 - fVar27;
    pfVar2 = data + lVar4 * 4;
    *pfVar2 = fVar25 + fVar21;
    pfVar2[1] = fVar16 + fVar22;
    pfVar2[2] = fVar8 + fVar12;
    pfVar2[3] = fVar23 + fVar13;
    pfVar2 = data + lVar4 * 4 + 8;
    *pfVar2 = fVar28 + fVar17;
    pfVar2[1] = fVar29 + fVar18;
    pfVar2[2] = fVar30 + fVar19;
    pfVar2[3] = fVar31 + fVar20;
    pfVar2 = data + lVar4 * 4 + 0x10;
    *pfVar2 = fVar40 + fVar36;
    pfVar2[1] = fVar41 + fVar37;
    pfVar2[2] = fVar42 + fVar38;
    pfVar2[3] = fVar43 + fVar39;
    pfVar2 = data + lVar4 * 4 + 0x18;
    *pfVar2 = fVar9 + fVar32;
    pfVar2[1] = fVar24 + fVar33;
    pfVar2[2] = fVar10 + fVar34;
    pfVar2[3] = fVar11 + fVar35;
    pfVar2 = data + lVar4 * 4 + 0x20;
    *pfVar2 = fVar32 - fVar9;
    pfVar2[1] = fVar33 - fVar24;
    pfVar2[2] = fVar34 - fVar10;
    pfVar2[3] = fVar35 - fVar11;
    pfVar2 = data + lVar4 * 4 + 0x28;
    *pfVar2 = fVar36 - fVar40;
    pfVar2[1] = fVar37 - fVar41;
    pfVar2[2] = fVar38 - fVar42;
    pfVar2[3] = fVar39 - fVar43;
    pfVar2 = data + lVar4 * 4 + 0x30;
    *pfVar2 = fVar17 - fVar28;
    pfVar2[1] = fVar18 - fVar29;
    pfVar2[2] = fVar19 - fVar30;
    pfVar2[3] = fVar20 - fVar31;
    pfVar2 = data + lVar4 * 4 + 0x38;
    *pfVar2 = fVar21 - fVar25;
    pfVar2[1] = fVar22 - fVar16;
    pfVar2[2] = fVar12 - fVar8;
    pfVar2[3] = fVar13 - fVar23;
    pfVar5 = pfVar5 + 4;
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  return;
}

Assistant:

static void
dctInverse8x8_sse2_6 (float* data)
{
    dctInverse8x8_sse2 (data, 6);
}